

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanInstance.cpp
# Opt level: O0

VkPhysicalDevice __thiscall
VulkanUtilities::VulkanInstance::SelectPhysicalDeviceForOpenXR
          (VulkanInstance *this,OpenXRInfo *XRInfo)

{
  OpenXRInfo *XRInfo_local;
  VulkanInstance *this_local;
  
  Diligent::LogError<true,char[76]>
            (false,"SelectPhysicalDeviceForOpenXR",
             "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/VulkanUtilities/VulkanInstance.cpp"
             ,0x2cb,(char (*) [76])
                    "OpenXR is not supported. Use DILIGENT_USE_OPENXR CMake option to enable it.");
  return (VkPhysicalDevice)0x0;
}

Assistant:

VkPhysicalDevice VulkanInstance::SelectPhysicalDeviceForOpenXR(const CreateInfo::OpenXRInfo& XRInfo) const noexcept(false)
{
#if DILIGENT_USE_OPENXR
    XrInstance xrInstance = XR_NULL_HANDLE;
    static_assert(sizeof(XrInstance) == sizeof(XRInfo.Instance), "XrInstance size mismatch");
    memcpy(&xrInstance, &XRInfo.Instance, sizeof(XrInstance));

    XrVulkanGraphicsDeviceGetInfoKHR vkGraphicsDeviceGetInfo{XR_TYPE_VULKAN_GRAPHICS_DEVICE_GET_INFO_KHR};
    static_assert(sizeof(vkGraphicsDeviceGetInfo.systemId) == sizeof(XRInfo.SystemId), "SystemId Size mismatch");
    memcpy(&vkGraphicsDeviceGetInfo.systemId, &XRInfo.SystemId, sizeof(vkGraphicsDeviceGetInfo.systemId));
    vkGraphicsDeviceGetInfo.vulkanInstance = m_VkInstance;

    PFN_xrGetInstanceProcAddr         xrGetInstanceProcAddr         = reinterpret_cast<PFN_xrGetInstanceProcAddr>(XRInfo.GetInstanceProcAddr);
    PFN_xrGetVulkanGraphicsDevice2KHR xrGetVulkanGraphicsDevice2KHR = nullptr;
    if (XR_FAILED(xrGetInstanceProcAddr(xrInstance, "xrGetVulkanGraphicsDevice2KHR", reinterpret_cast<PFN_xrVoidFunction*>(&xrGetVulkanGraphicsDevice2KHR))))
    {
        LOG_ERROR_AND_THROW("Failed to get xrGetVulkanGraphicsDevice2KHR function");
    }

    VkPhysicalDevice vkDevice = VK_NULL_HANDLE;
    if (XR_FAILED(xrGetVulkanGraphicsDevice2KHR(xrInstance, &vkGraphicsDeviceGetInfo, &vkDevice)))
    {
        LOG_ERROR_AND_THROW("Failed to get Vulkan physical device for OpenXR");
    }

    return vkDevice;
#else
    LOG_ERROR_AND_THROW("OpenXR is not supported. Use DILIGENT_USE_OPENXR CMake option to enable it.");
    return VK_NULL_HANDLE; // Triggers unreachable code warning on MSVC
#endif
}